

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O1

void __thiscall
Assimp::SMDImporter::InternReadFile
          (SMDImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  pointer pBVar1;
  pointer pBVar2;
  Logger *this_00;
  uint *puVar3;
  ulong uVar4;
  runtime_error *this_01;
  SkeletonMeshBuilder skeleton;
  undefined1 local_78 [24];
  pointer local_60;
  pointer local_50;
  pointer local_48;
  pointer local_38;
  
  this->pScene = pScene;
  ReadSmd(this,pFile,pIOHandler);
  if ((this->asTriangles).super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->asTriangles).super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    if ((this->asBones).super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (this->asBones).super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_78._0_8_ = local_78 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_78,
                 "SMD: No triangles and no bones have been found in the file. This file seems to be invalid."
                 ,"");
      std::runtime_error::runtime_error(this_01,(string *)local_78);
      *(undefined ***)this_01 = &PTR__runtime_error_007fd498;
      __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    *(byte *)&pScene->mFlags = (byte)pScene->mFlags | 1;
  }
  pBVar2 = (this->asBones).super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar1 = (this->asBones).super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pBVar2 != pBVar1) {
    do {
      if ((pBVar2->mName)._M_string_length == 0) {
        this_00 = DefaultLogger::get();
        Logger::warn(this_00,"SMD: Not all bones have been initialized");
        break;
      }
      pBVar2 = pBVar2 + 1;
    } while (pBVar2 != pBVar1);
    FixTimeValues(this);
  }
  CreateOutputNodes(this);
  if ((pScene->mFlags & 1) == 0) {
    CreateOutputMeshes(this);
    CreateOutputMaterials(this);
    pScene->mRootNode->mNumMeshes = pScene->mNumMeshes;
    puVar3 = (uint *)operator_new__((ulong)pScene->mNumMeshes << 2);
    pScene->mRootNode->mMeshes = puVar3;
    if (pScene->mNumMeshes != 0) {
      uVar4 = 0;
      do {
        pScene->mRootNode->mMeshes[uVar4] = (uint)uVar4;
        uVar4 = uVar4 + 1;
      } while (uVar4 < pScene->mNumMeshes);
    }
  }
  CreateOutputAnimations(this,pFile,pIOHandler);
  if (((pScene->mFlags & 1) != 0) && (this->noSkeletonMesh == false)) {
    SkeletonMeshBuilder::SkeletonMeshBuilder
              ((SkeletonMeshBuilder *)local_78,pScene,(aiNode *)0x0,false);
    if (local_48 != (pointer)0x0) {
      operator_delete(local_48,(long)local_38 - (long)local_48);
    }
    if (local_60 != (pointer)0x0) {
      operator_delete(local_60,(long)local_50 - (long)local_60);
    }
    if ((pointer)local_78._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ - local_78._0_8_);
    }
  }
  return;
}

Assistant:

void SMDImporter::InternReadFile( const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler) {
    this->pScene = pScene;
    ReadSmd(pFile, pIOHandler);

    // If there are no triangles it seems to be an animation SMD,
    // containing only the animation skeleton.
    if (asTriangles.empty()) {
        if (asBones.empty()) {
            throw DeadlyImportError("SMD: No triangles and no bones have "
                "been found in the file. This file seems to be invalid.");
        }

        // Set the flag in the scene structure which indicates
        // that there is nothing than an animation skeleton
        pScene->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;
    }

    if (!asBones.empty()) {
        // Check whether all bones have been initialized
        for (std::vector<SMD::Bone>::const_iterator
                i =  asBones.begin();
                i != asBones.end();++i) {
            if (!(*i).mName.length()) {
                ASSIMP_LOG_WARN("SMD: Not all bones have been initialized");
                break;
            }
        }

        // now fix invalid time values and make sure the animation starts at frame 0
        FixTimeValues();
    }

    // build output nodes (bones are added as empty dummy nodes)
    CreateOutputNodes();

    if (!(pScene->mFlags & AI_SCENE_FLAGS_INCOMPLETE)) {
        // create output meshes
        CreateOutputMeshes();

        // build an output material list
        CreateOutputMaterials();

        // use root node that renders all meshes
        pScene->mRootNode->mNumMeshes = pScene->mNumMeshes;
        pScene->mRootNode->mMeshes = new unsigned int[pScene->mNumMeshes];
        for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
            pScene->mRootNode->mMeshes[i] = i;
        }
    }

    // build the output animation
    CreateOutputAnimations(pFile, pIOHandler);

    if ((pScene->mFlags & AI_SCENE_FLAGS_INCOMPLETE) && !noSkeletonMesh) {
        SkeletonMeshBuilder skeleton(pScene);
    }
}